

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nukedopl3.cpp
# Opt level: O3

void envelope_calc(opl_slot *slot)

{
  byte bVar1;
  ushort uVar2;
  undefined2 uVar3;
  Bit8u BVar4;
  uint uVar5;
  ulong uVar6;
  
  uVar6 = (ulong)(slot->eg_rate >> 2);
  uVar5 = slot->eg_rate & 3;
  bVar1 = ""[uVar6];
  if (uVar6 - 1 < 0xb) {
    uVar2 = slot->chip->timer;
    if (((uint)uVar2 & ~(-1 << (bVar1 & 0x1f))) == 0) {
      BVar4 = eg_incstep[""[uVar6]][uVar5][uVar2 >> (bVar1 & 0x1f) & 7];
    }
    else {
      BVar4 = '\0';
    }
  }
  else {
    BVar4 = eg_incstep[""[uVar6]][(byte)uVar5][slot->chip->timer & 7] << (-bVar1 & 0x1f);
  }
  slot->eg_inc = BVar4;
  uVar3 = slot->eg_rout;
  slot->eg_out = (ushort)*slot->trem + (ushort)slot->reg_tl * 4 + uVar3 +
                 (ushort)(slot->eg_ksl >> ("\b\x01\x02"[slot->reg_ksl] & 0x1f));
  (*envelope_gen[slot->eg_gen])(slot);
  return;
}

Assistant:

void envelope_calc(opl_slot *slot) {
	Bit8u rate_h, rate_l;
	rate_h = slot->eg_rate >> 2;
	rate_l = slot->eg_rate & 3;
	Bit8u inc = 0;
	if (eg_incsh[rate_h] > 0) {
		if ((slot->chip->timer & ((1 << eg_incsh[rate_h]) - 1)) == 0) {
			inc = eg_incstep[eg_incdesc[rate_h]][rate_l][((slot->chip->timer) >> eg_incsh[rate_h]) & 0x07];
		}
	}
	else {
		inc = eg_incstep[eg_incdesc[rate_h]][rate_l][slot->chip->timer & 0x07] << (-eg_incsh[rate_h]);
	}
	slot->eg_inc = inc;
	slot->eg_out = slot->eg_rout + (slot->reg_tl << 2) + (slot->eg_ksl >> kslshift[slot->reg_ksl]) + *slot->trem;
	envelope_gen[slot->eg_gen](slot);
}